

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O3

void bc7enc_compress_block_init(void)

{
  ulong uVar1;
  bool bVar2;
  int c;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong in_RDX;
  uint32_t l;
  ulong uVar6;
  ulong in_RSI;
  bool bVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint32_t l_1;
  int iVar17;
  uint uVar18;
  
  lVar3 = 0;
  do {
    lVar9 = 0;
    bVar2 = true;
    do {
      bVar7 = bVar2;
      iVar16 = (int)lVar9 * 2;
      uVar6 = 0;
      uVar11 = 0xffff;
      do {
        uVar13 = 0;
        iVar17 = iVar16;
        do {
          iVar14 = ((uint)(((int)(uVar6 >> 5) + (int)uVar6 * 4 + iVar16) * 0x2e + 0x20 +
                          ((int)(uVar13 >> 5) + iVar17) * 0x12) >> 6) - (int)lVar3;
          uVar15 = iVar14 * iVar14;
          uVar12 = uVar11 & 0xffff;
          uVar1 = in_RSI;
          uVar11 = uVar12;
          if (uVar15 < uVar12) {
            uVar1 = uVar6;
            uVar11 = uVar15;
          }
          in_RSI = uVar1 & 0xff;
          in_RDX = in_RDX & 0xff;
          if (uVar15 < uVar12) {
            in_RDX = uVar13;
          }
          uVar12 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar12;
          iVar17 = iVar17 + 4;
        } while (uVar12 != 0x40);
        uVar12 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar12;
      } while (uVar12 != 0x40);
      g_bc7_mode_1_optimal_endpoints[lVar3][lVar9].m_error = (uint16_t)uVar11;
      *(char *)(lVar3 * 8 + 0x169182 + lVar9 * 4) = (char)uVar1;
      *(char *)(lVar3 * 8 + 0x169183 + lVar9 * 4) = (char)in_RDX;
      lVar9 = 1;
      bVar2 = false;
    } while (bVar7);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  lVar3 = 0;
  do {
    lVar9 = 0;
    bVar2 = true;
    do {
      bVar7 = bVar2;
      lVar10 = 0;
      bVar2 = true;
      do {
        bVar8 = bVar2;
        uVar15 = 0xffff;
        uVar18 = 0;
        uVar11 = 0;
        uVar12 = 0;
        do {
          uVar5 = 0;
          iVar16 = (int)lVar9 * 4;
          do {
            iVar17 = (((uVar5 >> 3) + iVar16) * 0x15 +
                      ((uVar18 >> 3) + (int)lVar10 * 4 + uVar18 * 8) * 0x2b + 0x20 >> 6) -
                     (int)lVar3;
            uVar4 = iVar17 * iVar17;
            uVar15 = uVar15 & 0xffff;
            uVar12 = uVar12 & 0xff;
            if (uVar4 < uVar15) {
              uVar15 = uVar4;
              uVar11 = uVar18 & 0xff;
              uVar12 = uVar5;
            }
            uVar5 = uVar5 + 1;
            iVar16 = iVar16 + 8;
          } while (uVar5 != 0x20);
          uVar18 = uVar18 + 1;
        } while (uVar18 != 0x20);
        g_bc7_mode_7_optimal_endpoints[lVar3][lVar9][lVar10].m_error = (uint16_t)uVar15;
        g_bc7_mode_7_optimal_endpoints[lVar3][lVar9][lVar10].m_lo = (uint8_t)uVar11;
        g_bc7_mode_7_optimal_endpoints[lVar3][lVar9][lVar10].m_hi = (uint8_t)uVar12;
        lVar10 = 1;
        bVar2 = false;
      } while (bVar8);
      lVar9 = 1;
      bVar2 = false;
    } while (bVar7);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  return;
}

Assistant:

void bc7enc_compress_block_init()
{
	for (int c = 0; c < 256; c++)
	{
		for (uint32_t lp = 0; lp < 2; lp++)
		{
			endpoint_err best;
			best.m_error = (uint16_t)UINT16_MAX;
			for (uint32_t l = 0; l < 64; l++)
			{
				uint32_t low = ((l << 1) | lp) << 1;
				low |= (low >> 7);
				for (uint32_t h = 0; h < 64; h++)
				{
					uint32_t high = ((h << 1) | lp) << 1;
					high |= (high >> 7);
					const int k = (low * (64 - g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX]) + high * g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX] + 32) >> 6;
					const int err = (k - c) * (k - c);
					if (err < best.m_error)
					{
						best.m_error = (uint16_t)err;
						best.m_lo = (uint8_t)l;
						best.m_hi = (uint8_t)h;
					}
				} // h
			} // l
			g_bc7_mode_1_optimal_endpoints[c][lp] = best;
		} // lp
	} // c

	// Mode 7: 555.1 2-bit indices 
	for (int c = 0; c < 256; c++)
	{
		for (uint32_t hp = 0; hp < 2; hp++)
		{
			for (uint32_t lp = 0; lp < 2; lp++)
			{
				endpoint_err best;
				best.m_error = (uint16_t)UINT16_MAX;
				best.m_lo = 0;
				best.m_hi = 0;

				for (uint32_t l = 0; l < 32; l++)
				{
					uint32_t low = ((l << 1) | lp) << 2;
					low |= (low >> 6);

					for (uint32_t h = 0; h < 32; h++)
					{
						uint32_t high = ((h << 1) | hp) << 2;
						high |= (high >> 6);

						const int k = (low * (64 - g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX]) + high * g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX] + 32) >> 6;

						const int err = (k - c) * (k - c);
						if (err < best.m_error)
						{
							best.m_error = (uint16_t)err;
							best.m_lo = (uint8_t)l;
							best.m_hi = (uint8_t)h;
						}
					} // h
				} // l

				g_bc7_mode_7_optimal_endpoints[c][hp][lp] = best;

			} // hp

		} // lp

	} // c
}